

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O0

bool __thiscall glslang::HlslGrammar::acceptControlDeclaration(HlslGrammar *this,TIntermNode **node)

{
  bool bVar1;
  size_type sVar2;
  TIntermNode *pTVar3;
  TIntermTyped *local_110;
  TIntermTyped *expressionNode;
  HlslToken idToken;
  undefined1 local_d8 [8];
  TType type;
  TAttributes attributes;
  TIntermNode **node_local;
  HlslGrammar *this_local;
  
  *node = (TIntermNode *)0x0;
  TList<glslang::TAttributeArgs>::TList((TList<glslang::TAttributeArgs> *)&type.spirvType);
  TType::TType((TType *)local_d8,EbtVoid,EvqTemporary,1,0,0,false);
  bVar1 = acceptFullySpecifiedType(this,(TType *)local_d8,(TAttributes *)&type.spirvType);
  if (bVar1) {
    sVar2 = std::__cxx11::
            list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>::size
                      ((list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>
                        *)&type.spirvType);
    if (sVar2 != 0) {
      (*(this->parseContext->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions
        [0x2e])(this->parseContext,&(this->super_HlslTokenStream).token,
                "attributes don\'t apply to control declaration","");
    }
    bVar1 = HlslTokenStream::peekTokenClass(&this->super_HlslTokenStream,EHTokLeftParen);
    if (bVar1) {
      HlslTokenStream::recedeToken(&this->super_HlslTokenStream);
      this_local._7_1_ = false;
    }
    else {
      HlslToken::HlslToken((HlslToken *)&expressionNode);
      bVar1 = acceptIdentifier(this,(HlslToken *)&expressionNode);
      if (bVar1) {
        local_110 = (TIntermTyped *)0x0;
        bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokAssign);
        if (bVar1) {
          bVar1 = acceptExpression(this,&local_110);
          if (bVar1) {
            pTVar3 = HlslParseContext::declareVariable
                               (this->parseContext,(TSourceLoc *)&expressionNode,
                                (TString *)idToken._24_8_,(TType *)local_d8,local_110);
            *node = pTVar3;
            this_local._7_1_ = true;
          }
          else {
            expected(this,"initializer");
            this_local._7_1_ = false;
          }
        }
        else {
          expected(this,"=");
          this_local._7_1_ = false;
        }
      }
      else {
        expected(this,"identifier");
        this_local._7_1_ = false;
      }
    }
  }
  else {
    this_local._7_1_ = false;
  }
  idToken.field_2._4_4_ = 1;
  TType::~TType((TType *)local_d8);
  TList<glslang::TAttributeArgs>::~TList((TList<glslang::TAttributeArgs> *)&type.spirvType);
  return this_local._7_1_;
}

Assistant:

bool HlslGrammar::acceptControlDeclaration(TIntermNode*& node)
{
    node = nullptr;
    TAttributes attributes;

    // fully_specified_type
    TType type;
    if (! acceptFullySpecifiedType(type, attributes))
        return false;

    if (attributes.size() > 0)
        parseContext.warn(token.loc, "attributes don't apply to control declaration", "", "");

    // filter out type casts
    if (peekTokenClass(EHTokLeftParen)) {
        recedeToken();
        return false;
    }

    // identifier
    HlslToken idToken;
    if (! acceptIdentifier(idToken)) {
        expected("identifier");
        return false;
    }

    // EQUAL
    TIntermTyped* expressionNode = nullptr;
    if (! acceptTokenClass(EHTokAssign)) {
        expected("=");
        return false;
    }

    // expression
    if (! acceptExpression(expressionNode)) {
        expected("initializer");
        return false;
    }

    node = parseContext.declareVariable(idToken.loc, *idToken.string, type, expressionNode);

    return true;
}